

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateDefaultInstanceInitializer
          (MessageGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  Type TVar3;
  Descriptor *pDVar4;
  FieldGenerator *pFVar5;
  long *plVar6;
  size_type *psVar7;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *pFVar8;
  long lVar9;
  long lVar10;
  string name;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  Printer *local_48;
  FieldDescriptor *local_40;
  FieldGeneratorMap *local_38;
  
  pDVar4 = this->descriptor_;
  if (*(char *)(*(long *)(pDVar4 + 0x20) + 0x6b) != '\0') {
    io::Printer::Print(printer,
                       "_$classname$_default_instance_.get_mutable()->set_default_instance(_$classname$_default_instance_.get_mutable());\n_$classname$_default_instance_.get_mutable()->InitAsDefaultInstance();\n"
                       ,"classname",&this->classname_);
    return;
  }
  if (0 < *(int *)(pDVar4 + 0x2c)) {
    local_50 = &this->classname_;
    paVar1 = &local_b0.field_2;
    local_38 = &this->field_generators_;
    lVar10 = 0;
    lVar9 = 0;
    local_48 = printer;
    do {
      lVar2 = *(long *)(pDVar4 + 0x30);
      if (*(int *)(lVar2 + 0x4c + lVar10) == 3) {
LAB_00254fca:
        if ((*(long *)(lVar2 + 0x60 + lVar10) != 0) &&
           (((this->options_).enforce_lite == false &&
            (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)))) {
          pFVar5 = FieldGeneratorMap::get
                             (local_38,(FieldDescriptor *)
                                       (*(long *)(this->descriptor_ + 0x30) + lVar10));
          (*pFVar5->_vptr_FieldGenerator[0xe])(pFVar5,local_48);
        }
      }
      else {
        local_40 = (FieldDescriptor *)(lVar2 + lVar10);
        TVar3 = FieldDescriptor::type(local_40);
        if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4) != 10) ||
           ((*(long *)(lVar2 + 0x60 + lVar10) != 0 &&
            (((this->options_).enforce_lite != false ||
             (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) == 3))))))
        goto LAB_00254fca;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        if ((*(long *)(lVar2 + 0x60 + lVar10) == 0) &&
           (*(char *)(*(long *)(lVar2 + 0x80 + lVar10) + 0x6f) != '\x01')) {
          std::operator+(&local_90,"_",local_50);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
        }
        else {
          std::operator+(&local_90,"_",local_50);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
        }
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_b0.field_2._M_allocated_capacity = *psVar7;
          local_b0.field_2._8_8_ = plVar6[3];
          local_b0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar7;
          local_b0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_b0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b0);
        pFVar8 = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          pFVar8 = extraout_RDX_00;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          pFVar8 = extraout_RDX_01;
        }
        FieldName_abi_cxx11_(&local_b0,(cpp *)local_40,pFVar8);
        std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0._M_dataplus._M_p);
        pFVar8 = extraout_RDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          pFVar8 = extraout_RDX_03;
        }
        FieldMessageTypeName_abi_cxx11_(&local_b0,(cpp *)local_40,pFVar8);
        io::Printer::Print(local_48,
                           "$name$_ = const_cast< $type$*>(\n    $type$::internal_default_instance());\n"
                           ,"name",&local_70,"type",&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]) + 1);
        }
      }
      lVar9 = lVar9 + 1;
      pDVar4 = this->descriptor_;
      lVar10 = lVar10 + 0xa8;
    } while (lVar9 < *(int *)(pDVar4 + 0x2c));
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateDefaultInstanceInitializer(io::Printer* printer) {
  if (IsMapEntryMessage(descriptor_)) {
    printer->Print(
        "_$classname$_default_instance_.get_mutable()->set_default_instance(_$"
        "classname$_default_instance_.get_mutable());\n"
        "_$classname$_default_instance_.get_mutable()->InitAsDefaultInstance();"
        "\n",
        "classname", classname_);
    return;
  }

  // The default instance needs all of its embedded message pointers
  // cross-linked to other default instances.  We can't do this initialization
  // in the constructor because some other default instances may not have been
  // constructed yet at that time.
  // TODO(kenton):  Maybe all message fields (even for non-default messages)
  //   should be initialized to point at default instances rather than NULL?
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated() &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        (field->containing_oneof() == NULL ||
         HasDescriptorMethods(descriptor_->file(), options_))) {
      string name;
      if (field->containing_oneof() || field->options().weak()) {
        name = "_" + classname_ + "_default_instance_.";
      } else {
        name = "_" + classname_ + "_default_instance_.get_mutable()->";
      }
      name += FieldName(field);
      printer->Print(
          "$name$_ = const_cast< $type$*>(\n"
          "    $type$::internal_default_instance());\n",
          // Vars.
          "name", name, "type", FieldMessageTypeName(field));
    } else if (field->containing_oneof() &&
               HasDescriptorMethods(descriptor_->file(), options_)) {
      field_generators_.get(descriptor_->field(i))
          .GenerateConstructorCode(printer);
    }
  }
}